

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_syntax.cpp
# Opt level: O0

ParserState * giveup_to_expected(ParserState *__return_storage_ptr__,ParserState *state,char *what)

{
  token_iterator context;
  bool bVar1;
  string *error;
  ParserError local_f0;
  BasicCStringRef<char> local_c0;
  string local_b8;
  ParserError local_98;
  iterator local_68;
  ParserError *e;
  iterator __end2;
  iterator __begin2;
  SmallVectorTemplateCommon<ParserError,_void> *local_40;
  SmallVector<ParserError,_1U> *__range2;
  undefined1 local_21;
  char *local_20;
  char *what_local;
  ParserState *state_local;
  ParserState *new_state;
  
  error = (string *)__return_storage_ptr__;
  local_20 = what;
  what_local = (char *)state;
  state_local = __return_storage_ptr__;
  bVar1 = is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>
                    (state);
  if (bVar1) {
    eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::variant
              (__return_storage_ptr__,state);
  }
  else {
    local_21 = 0;
    ParserSuccess::ParserSuccess((ParserSuccess *)&__range2,(nullptr_t)0x0);
    eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>::
    variant<ParserSuccess,0ul,ParserSuccess>
              ((variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>> *)
               __return_storage_ptr__,(ParserSuccess *)&__range2);
    ParserSuccess::~ParserSuccess((ParserSuccess *)&__range2);
    local_40 = (SmallVectorTemplateCommon<ParserError,_void> *)
               eggs::variants::
               get<llvm_vecsmall::SmallVector<ParserError,1u>,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>,1ul>
                         (state);
    __end2 = llvm_vecsmall::SmallVectorTemplateCommon<ParserError,_void>::begin(local_40);
    e = llvm_vecsmall::SmallVectorTemplateCommon<ParserError,_void>::end(local_40);
    for (; __end2 != e; __end2 = __end2 + 1) {
      local_68 = __end2;
      if (__end2->state == GiveUp) {
        context = __end2->context;
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_c0,"expected {}");
        fmt::format<char_const*>
                  (&local_b8,(fmt *)local_c0.data_,(CStringRef)&local_20,(char **)error);
        error = &local_b8;
        ParserError::ParserError(&local_98,Error,context,error);
        add_error(__return_storage_ptr__,&local_98);
        ParserError::~ParserError(&local_98);
        std::__cxx11::string::~string((string *)&local_b8);
      }
      else {
        ParserError::ParserError(&local_f0,__end2);
        add_error(__return_storage_ptr__,&local_f0);
        ParserError::~ParserError(&local_f0);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static ParserState giveup_to_expected(ParserState state, const char* what)
{
    if(!is<ParserSuccess>(state))
    {
        ParserState new_state = ParserSuccess(nullptr);
        for(auto& e : get<ParserFailure>(state))
        {
            if(e.state == ParserStatus::GiveUp)
                add_error(new_state, ParserError(ParserStatus::Error, e.context, fmt::format("expected {}", what)));
            else
                add_error(new_state, std::move(e));
        }
        return new_state;
    }
    return state;
}